

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O0

string * create_file_with_removed_comments(string *__return_storage_ptr__,string *file_name)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  istream *piVar4;
  ostream *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string local_4a0 [8];
  string line;
  ofstream local_478 [8];
  ofstream no_comment_file_write;
  string local_278 [32];
  undefined1 local_258 [8];
  string no_comment_name;
  allocator local_22d [13];
  ifstream local_220 [8];
  ifstream file;
  string *file_name_local;
  
  std::ifstream::ifstream(local_220,file_name,8);
  bVar1 = problem_with_file_to_read(local_220,file_name);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_22d);
    std::allocator<char>::~allocator((allocator<char> *)local_22d);
    no_comment_name.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_278,(ulong)file_name);
    pcVar2 = (char *)std::__cxx11::string::append((char *)local_278);
    psVar3 = (string *)std::__cxx11::string::append(pcVar2);
    std::__cxx11::string::string((string *)local_258,psVar3);
    std::__cxx11::string::~string(local_278);
    std::ofstream::ofstream(local_478,local_258,0x10);
    bVar1 = problem_with_file_to_write(local_478,(string *)local_258);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"",(allocator *)(line.field_2._M_local_buf + 0xf))
      ;
      std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xf));
      no_comment_name.field_2._12_4_ = 1;
    }
    else {
      std::__cxx11::string::string(local_4a0);
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_220,local_4a0);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar1) break;
        std::__cxx11::string::substr((ulong)&local_4c0,(ulong)local_4a0);
        bVar1 = std::operator!=(&local_4c0,"<!--");
        std::__cxx11::string::~string((string *)&local_4c0);
        if (bVar1) {
          this = std::operator<<((ostream *)local_478,local_4a0);
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_258);
      no_comment_name.field_2._12_4_ = 1;
      std::__cxx11::string::~string(local_4a0);
    }
    std::ofstream::~ofstream(local_478);
    std::__cxx11::string::~string((string *)local_258);
  }
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

string create_file_with_removed_comments(const string &file_name) {
    // Open the files:
    ifstream file(file_name);
    if (problem_with_file_to_read(file, file_name)) return "";
    string no_comment_name = file_name.substr(0, file_name.length() - 4).append("_no_comment").append(".txt");
    ofstream no_comment_file_write(no_comment_name);
    if (problem_with_file_to_write(no_comment_file_write, no_comment_name)) return "";
    // Copy content, but only NON-comment lines:
    string line;
    while (getline(file, line)) {
        if (line.substr(0, 4) != COMMENT) no_comment_file_write << line << endl;
    }
    file.close();
    no_comment_file_write.close();

    return no_comment_name;
}